

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QWellArray::setCurrent(QWellArray *this,int row,int col)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int oldCol;
  int oldRow;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 local_10;
  undefined4 local_c;
  
  if ((*(int *)(in_RDI + 0x38) != in_ESI) || (*(int *)(in_RDI + 0x3c) != in_EDX)) {
    if ((in_ESI < 0) || (local_10 = in_EDX, local_c = in_ESI, in_EDX < 0)) {
      local_10 = -1;
      local_c = -1;
    }
    uVar2 = *(undefined4 *)(in_RDI + 0x38);
    uVar1 = *(undefined4 *)(in_RDI + 0x3c);
    *(int *)(in_RDI + 0x38) = local_c;
    *(int *)(in_RDI + 0x3c) = local_10;
    updateCell((QWellArray *)CONCAT44(uVar2,uVar1),(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    updateCell((QWellArray *)CONCAT44(uVar2,uVar1),(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    currentChanged((QWellArray *)0x731574,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QWellArray::setCurrent(int row, int col)
{
    if ((curRow == row) && (curCol == col))
        return;

    if (row < 0 || col < 0)
        row = col = -1;

    int oldRow = curRow;
    int oldCol = curCol;

    curRow = row;
    curCol = col;

    updateCell(oldRow, oldCol);
    updateCell(curRow, curCol);

    emit currentChanged(curRow, curCol);
}